

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall
UDPSplitPacketReader::SplitPacket::SplitPacket(SplitPacket *this,void **vtt,int size)

{
  _func_int **pp_Var1;
  buf_t *pbVar2;
  ulong uVar3;
  
  (this->super_BufferReader).super_Buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00115e58;
  uVar3 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar3 = (long)size;
  }
  pbVar2 = (buf_t *)operator_new__(uVar3);
  (this->super_BufferReader).super_Buffer.buf_current = pbVar2;
  (this->super_BufferReader).super_Buffer.buf_start = pbVar2;
  (this->super_BufferReader).super_Buffer.buf_end = pbVar2 + size;
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_BufferReader).super_Buffer._vptr_Buffer = pp_Var1;
  *(void **)((long)&(this->super_BufferReader).super_Buffer._vptr_Buffer + (long)pp_Var1[-3]) =
       vtt[2];
  (this->super_BufferReader).read_end = pbVar2;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_BufferReader).super_Buffer._vptr_Buffer = pp_Var1;
  *(void **)((long)&(this->super_BufferReader).super_Buffer._vptr_Buffer + (long)pp_Var1[-3]) =
       vtt[3];
  *(undefined8 *)((long)&(this->previous)._M_node + 4) = 0;
  *(undefined8 *)((long)&(this->start)._M_node + 4) = 0;
  *(undefined8 *)&(this->super_BufferReader).field_0x28 = 0;
  (this->previous)._M_node = (_List_node_base *)0x0;
  return;
}

Assistant:

UDPSplitPacketReader::SplitPacket::SplitPacket(int size) : BufferReader(size) {
  hasNext = hasPrevious = hasStart = hasEnd = false;
}